

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::we_have(torrent *this,piece_index_t index,bool loading_resume)

{
  _Atomic_word *p_Var1;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *plVar2;
  byte bVar3;
  pointer psVar4;
  pointer pppVar5;
  peer_connection *this_00;
  pointer __dest;
  torrent *this_01;
  char cVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  time_point32 tVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar11;
  undefined7 in_register_00000011;
  pointer psVar12;
  pointer pppVar13;
  ulong uVar14;
  _List_node_base *p_Var15;
  shared_ptr<libtorrent::aux::peer_connection> p;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_60;
  undefined4 local_5c;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  torrent *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000011,loading_resume);
  local_60.m_val = index.m_val;
  iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x4b])();
  counters::inc_stats_counter((counters *)CONCAT44(extraout_var,iVar8),0x6d,1);
  psVar4 = (this->m_predictive_pieces).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar12 = (this->m_predictive_pieces).
            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar14 = (long)psVar12 - (long)psVar4 >> 2;
  while (__dest = psVar4, 0 < (long)uVar14) {
    uVar11 = uVar14 >> 1;
    uVar14 = ~uVar11 + uVar14;
    psVar4 = __dest + uVar11 + 1;
    if (index.m_val <= __dest[uVar11].m_val) {
      psVar4 = __dest;
      uVar14 = uVar11;
    }
  }
  bVar7 = true;
  if ((__dest != psVar12) && (__dest->m_val == index.m_val)) {
    psVar4 = __dest + 1;
    if (psVar4 != psVar12) {
      memmove(__dest,psVar4,(long)psVar12 - (long)psVar4);
      psVar12 = (this->m_predictive_pieces).
                super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->m_predictive_pieces).
    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar12 + -1;
    bVar7 = false;
  }
  pppVar13 = (this->super_torrent_hot_members).m_connections.
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             .
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pppVar5 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (pppVar13 != pppVar5) {
    do {
      ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::peer_connection,void>
                ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                 local_58._M_pod_data,
                 (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &(*pppVar13)->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
      peer_connection::received_piece((peer_connection *)local_58._M_unused._0_8_,index);
      cVar6 = (**(code **)(*local_58._M_unused._M_object + 8))();
      if (cVar6 == '\0') {
        if (bVar7) {
          peer_connection::announce_piece((peer_connection *)local_58._M_unused._0_8_,index);
        }
        else {
          peer_connection::fill_send_buffer((peer_connection *)local_58._M_unused._0_8_);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      pppVar13 = pppVar13 + 1;
    } while (pppVar13 != pppVar5);
  }
  this_01 = local_38;
  plVar2 = &local_38->m_extensions;
  for (p_Var15 = (local_38->m_extensions).
                 super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      p_Var15 != (_List_node_base *)plVar2; p_Var15 = p_Var15->_M_next) {
    (**(code **)((long)(p_Var15[1]._M_next)->_M_next + 0x18))(p_Var15[1]._M_next,index.m_val);
  }
  pppVar5 = (this_01->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pppVar13 = (this_01->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; pppVar13 != pppVar5;
      pppVar13 = pppVar13 + 1) {
    this_00 = *pppVar13;
    if ((((this_00->super_peer_connection_hot_members).field_0x28 & 0x10) != 0) &&
       (bVar7 = peer_connection::has_piece(this_00,index), bVar7)) {
      peer_connection::update_interest(this_00);
    }
  }
  if ((char)local_5c == '\0') {
    bVar3 = (this_01->m_need_save_resume_data).m_val;
    if ((bVar3 & 0x10) == 0) {
      (this_01->m_need_save_resume_data).m_val = bVar3 | 0x10;
      state_updated(this_01);
    }
    state_updated(this_01);
    bVar7 = want_tick(this_01);
    update_list(this_01,(torrent_list_index_t)0x1,bVar7);
  }
  iVar8 = (*(((this_01->super_torrent_hot_members).m_ses)->super_session_logger).
            _vptr_session_logger[5])();
  if ((*(uint *)(CONCAT44(extraout_var_00,iVar8) + 0x68) >> 0x16 & 1) != 0) {
    iVar8 = (*(((this_01->super_torrent_hot_members).m_ses)->super_session_logger).
              _vptr_session_logger[5])();
    get_handle((torrent *)&local_58);
    alert_manager::
    emplace_alert<libtorrent::piece_finished_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
              ((alert_manager *)CONCAT44(extraout_var_01,iVar8),(torrent_handle *)&local_58,
               &local_60);
    index.m_val = local_60.m_val;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(local_58._8_8_ + 0xc);
        iVar8 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar8 = *(_Atomic_word *)(local_58._8_8_ + 0xc);
        *(int *)(local_58._8_8_ + 0xc) = iVar8 + -1;
      }
      if (iVar8 == 1) {
        (**(code **)(*(long *)local_58._8_8_ + 0x18))();
        index.m_val = local_60.m_val;
      }
    }
  }
  local_58._8_8_ = 0;
  local_58._M_unused._M_function_pointer = (_func_void *)this_01;
  local_40 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:4322:6)>
             ::_M_invoke;
  local_48 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:4322:6)>
             ::_M_manager;
  aux::file_progress::update
            (&this_01->m_file_progress,
             &((this_01->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files,index,
             (function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)>
              *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  remove_time_critical_piece(this_01,(piece_index_t)local_60.m_val,true);
  uVar9 = (uint)((ulong)*(undefined8 *)&(this_01->super_torrent_hot_members).field_0x48 >> 0x39) & 6
  ;
  if (uVar9 - 2 < 4) {
    if ((uVar9 != 4) && (bVar7 = is_finished(this_01), bVar7)) {
      finished(this_01);
    }
    tVar10 = time_now32();
    (this_01->m_last_download).__d.__r = (rep_conflict)tVar10.__d.__r;
    if (((this_01->super_torrent_hot_members).field_0x4b & 0x20) != 0) {
      recalc_share_mode(this_01);
    }
  }
  bVar7 = want_tick(this_01);
  update_list(this_01,(torrent_list_index_t)0x1,bVar7);
  return;
}

Assistant:

void torrent::we_have(piece_index_t const index, bool const loading_resume)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(!has_picker() || m_picker->has_piece_passed(index));

		inc_stats_counter(counters::num_have_pieces);

		// at this point, we have the piece for sure. It has been
		// successfully written to disk. We may announce it to peers
		// (unless it has already been announced through predictive_piece_announce
		// feature).
		bool announce_piece = true;
#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		auto const it = std::lower_bound(m_predictive_pieces.begin()
			, m_predictive_pieces.end(), index);
		if (it != m_predictive_pieces.end() && *it == index)
		{
			// this means we've already announced the piece
			announce_piece = false;
			m_predictive_pieces.erase(it);
		}
#endif

		// make a copy of the peer list since peers
		// may disconnect while looping
		for (auto* c : m_connections)
		{
			auto p = c->self();

			// received_piece will check to see if we're still interested
			// in this peer, and if neither of us is interested in the other,
			// disconnect it.
			p->received_piece(index);
			if (p->is_disconnecting()) continue;

			// if we're not announcing the piece, it means we
			// already have, and that we might have received
			// a request for it, and not sending it because
			// we were waiting to receive the piece, now that
			// we have received it, try to send stuff (fill_send_buffer)
			if (announce_piece) p->announce_piece(index);
			else p->fill_send_buffer();
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			ext->on_piece_pass(index);
		}
#endif

		// since this piece just passed, we might have
		// become uninterested in some peers where this
		// was the last piece we were interested in
		// update_interest may disconnect the peer and
		// invalidate the iterator
		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			// if we're not interested already, no need to check
			if (!p->is_interesting()) continue;
			// if the peer doesn't have the piece we just got, it
			// shouldn't affect our interest
			if (!p->has_piece(index)) continue;
			p->update_interest();
		}

		if (!loading_resume)
		{
			set_need_save_resume(torrent_handle::if_download_progress);
			state_updated();
			update_want_tick();
		}

		if (m_ses.alerts().should_post<piece_finished_alert>())
			m_ses.alerts().emplace_alert<piece_finished_alert>(get_handle(), index);

		// update m_file_progress (if we have one)
		m_file_progress.update(m_torrent_file->files(), index
			, [this](file_index_t const file_index)
			{
				if (m_ses.alerts().should_post<file_completed_alert>())
				{
					// this file just completed, post alert
					m_ses.alerts().emplace_alert<file_completed_alert>(
						get_handle(), file_index);
				}
			});

#ifndef TORRENT_DISABLE_STREAMING
		remove_time_critical_piece(index, true);
#endif

		if (is_downloading_state(m_state))
		{
			if (m_state != torrent_status::finished
				&& m_state != torrent_status::seeding
				&& is_finished())
			{
				// torrent finished
				// i.e. all the pieces we're interested in have
				// been downloaded. Release the files (they will open
				// in read only mode if needed)
				finished();
				// if we just became a seed, picker is now invalid, since it
				// is deallocated by the torrent once it starts seeding
			}

			m_last_download = aux::time_now32();

#ifndef TORRENT_DISABLE_SHARE_MODE
			if (m_share_mode)
				recalc_share_mode();
#endif
		}
		update_want_tick();
	}